

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>::writeValueTo
          (TypedAttribute<Imf_2_5::PreviewImage> *this,OStream *os,int version)

{
  PreviewRgba *pPVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value)._width);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value)._height);
  uVar3 = (this->_value)._height * (this->_value)._width;
  pPVar1 = (this->_value)._pixels;
  uVar2 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    uStack_38._0_5_ = CONCAT14(pPVar1[uVar2].r,(undefined4)uStack_38);
    (*os->_vptr_OStream[2])(os,(long)&uStack_38 + 4,1);
    uStack_38._0_6_ = CONCAT15(pPVar1[uVar2].g,(undefined5)uStack_38);
    (*os->_vptr_OStream[2])(os,(long)&uStack_38 + 5,1);
    uStack_38._0_7_ = CONCAT16(pPVar1[uVar2].b,(undefined6)uStack_38);
    (*os->_vptr_OStream[2])(os,(long)&uStack_38 + 6,1);
    uStack_38 = CONCAT17(pPVar1[uVar2].a,(undefined7)uStack_38);
    (*os->_vptr_OStream[2])(os,(long)&uStack_38 + 7,1);
  }
  return;
}

Assistant:

void
PreviewImageAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.width());
    Xdr::write <StreamIO> (os, _value.height());

    int numPixels = _value.width() * _value.height();
    const PreviewRgba *pixels = _value.pixels();

    for (int i = 0; i < numPixels; ++i)
    {
	Xdr::write <StreamIO> (os, pixels[i].r);
	Xdr::write <StreamIO> (os, pixels[i].g);
	Xdr::write <StreamIO> (os, pixels[i].b);
	Xdr::write <StreamIO> (os, pixels[i].a);
    }
}